

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void Commands::Quake(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *arguments,Character *from)

{
  string *subject;
  uchar param;
  int iVar1;
  int iVar2;
  
  subject = (arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == subject) {
    param = '\x05';
  }
  else {
    iVar1 = util::to_int(subject);
    iVar2 = 8;
    if (iVar1 < 8) {
      iVar2 = iVar1;
    }
    param = '\x01';
    if (1 < iVar2) {
      param = (uchar)iVar2;
    }
  }
  Map::Effect(from->map,MAP_EFFECT_QUAKE,param);
  return;
}

Assistant:

void Quake(const std::vector<std::string>& arguments, Character* from)
{
	int strength = 5;

	if (arguments.size() >= 1)
		strength = std::max(1, std::min(8, util::to_int(arguments[0])));

	from->map->Effect(MAP_EFFECT_QUAKE, strength);
}